

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Displacement.cpp
# Opt level: O2

void __thiscall
OpenMD::DisplacementZ::correlateFrames(DisplacementZ *this,int frame1,int frame2,int timeBin)

{
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *pvVar1;
  long lVar2;
  long lVar3;
  pointer piVar4;
  pointer piVar5;
  vector<int,_std::allocator<int>_> s2;
  vector<int,_std::allocator<int>_> s1;
  _Vector_base<int,_std::allocator<int>_> local_88;
  _Vector_base<int,_std::allocator<int>_> local_68;
  Vector3d local_48;
  
  local_68._M_impl.super__Vector_impl_data._M_start = (int *)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (int *)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_start = (int *)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (int *)0x0;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)&local_68,
             (this->super_ObjectACF<OpenMD::Vector3<double>_>).
             super_AutoCorrFunc<OpenMD::Vector3<double>_>.
             super_TimeCorrFunc<OpenMD::Vector3<double>_>.sele1ToIndex_.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + frame1);
  pvVar1 = &(this->super_ObjectACF<OpenMD::Vector3<double>_>).
            super_AutoCorrFunc<OpenMD::Vector3<double>_>.
            super_TimeCorrFunc<OpenMD::Vector3<double>_>.sele1ToIndex_;
  if ((this->super_ObjectACF<OpenMD::Vector3<double>_>).super_AutoCorrFunc<OpenMD::Vector3<double>_>
      .super_TimeCorrFunc<OpenMD::Vector3<double>_>.uniqueSelections_ != false) {
    pvVar1 = &(this->super_ObjectACF<OpenMD::Vector3<double>_>).
              super_AutoCorrFunc<OpenMD::Vector3<double>_>.
              super_TimeCorrFunc<OpenMD::Vector3<double>_>.sele2ToIndex_;
  }
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)&local_88,
             (pvVar1->
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + frame2);
  piVar5 = local_68._M_impl.super__Vector_impl_data._M_start;
  for (piVar4 = local_88._M_impl.super__Vector_impl_data._M_start;
      (piVar5 != local_68._M_impl.super__Vector_impl_data._M_finish &&
      (piVar4 != local_88._M_impl.super__Vector_impl_data._M_finish)); piVar4 = piVar4 + 1) {
    lVar2 = -(long)piVar5;
    for (; (piVar5 != local_68._M_impl.super__Vector_impl_data._M_finish && (*piVar5 < *piVar4));
        piVar5 = piVar5 + 1) {
      lVar2 = lVar2 + -4;
    }
    lVar3 = -(long)piVar4;
    while( true ) {
      if (piVar4 == local_88._M_impl.super__Vector_impl_data._M_finish) goto LAB_00130d1c;
      if (*piVar5 <= *piVar4) break;
      piVar4 = piVar4 + 1;
      lVar3 = lVar3 + -4;
    }
    if ((piVar5 == local_68._M_impl.super__Vector_impl_data._M_finish) ||
       (piVar4 == local_88._M_impl.super__Vector_impl_data._M_finish)) break;
    calcCorrValImpl(&local_48,this,frame1,frame2,
                    (int)((ulong)-(lVar2 + (long)local_68._M_impl.super__Vector_impl_data._M_start)
                         >> 2),
                    (int)((ulong)-(lVar3 + (long)local_88._M_impl.super__Vector_impl_data._M_start)
                         >> 2),timeBin);
    piVar5 = piVar5 + 1;
  }
LAB_00130d1c:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_88);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_68);
  return;
}

Assistant:

void DisplacementZ::correlateFrames(int frame1, int frame2, int timeBin) {
    std::vector<int> s1;
    std::vector<int> s2;

    std::vector<int>::iterator i1;
    std::vector<int>::iterator i2;

    s1 = sele1ToIndex_[frame1];

    if (uniqueSelections_)
      s2 = sele2ToIndex_[frame2];
    else
      s2 = sele1ToIndex_[frame2];

    for (i1 = s1.begin(), i2 = s2.begin(); i1 != s1.end() && i2 != s2.end();
         ++i1, ++i2) {
      // If the selections are dynamic, they might not have the
      // same objects in both frames, so we need to roll either of
      // the selections until we have the same object to
      // correlate.

      while (i1 != s1.end() && *i1 < *i2) {
        ++i1;
      }

      while (i2 != s2.end() && *i2 < *i1) {
        ++i2;
      }

      if (i1 == s1.end() || i2 == s2.end()) break;

      calcCorrValImpl(frame1, frame2, i1 - s1.begin(), i2 - s2.begin(),
                      timeBin);
    }
  }